

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O1

int fy_atom_iter_utf8_quoted_get(fy_atom_iter *iter,size_t *lenp,uint8_t *buf)

{
  byte bVar1;
  ssize_t sVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong count;
  int ww;
  int local_34;
  
  if (buf == (uint8_t *)0x0 || (lenp == (size_t *)0x0 || iter == (fy_atom_iter *)0x0)) {
    return -1;
  }
  if (*lenp < 4) {
    return -1;
  }
  uVar5 = iter->unget_c;
  if (uVar5 != 0xffffffff) {
    iter->unget_c = -1;
    *lenp = 0;
    return uVar5 & 0xff;
  }
  sVar2 = fy_atom_iter_read(iter,buf,1);
  if (sVar2 != 1) {
    return -1;
  }
  bVar1 = *buf;
  uVar5 = 1;
  if ((((char)bVar1 < '\0') && (uVar5 = 2, (bVar1 & 0xe0) != 0xc0)) &&
     (uVar5 = 3, (bVar1 & 0xf0) != 0xe0)) {
    uVar5 = (uint)((bVar1 & 0xf8) == 0xf0) << 2;
  }
  if (uVar5 != 1) {
    if (uVar5 == 0) {
      *lenp = 1;
      return 0;
    }
    count = (ulong)(uVar5 - 1);
    uVar3 = fy_atom_iter_read(iter,buf + 1,count);
    if (uVar3 != count) {
      if ((long)uVar3 < (long)count && uVar3 != 0xffffffffffffffff) {
        *lenp = *lenp + uVar3;
        return 0;
      }
      return 0;
    }
    if (uVar5 == 0) {
      iVar4 = -1;
      goto LAB_00141096;
    }
  }
  iVar4 = (int)(char)*buf;
  if ((char)*buf < '\0') {
    iVar4 = fy_utf8_get_generic(buf,uVar5,&local_34);
  }
LAB_00141096:
  if (iVar4 < 0) {
    *lenp = (ulong)uVar5;
    return 0;
  }
  *lenp = 0;
  return iVar4;
}

Assistant:

int fy_atom_iter_utf8_quoted_get(struct fy_atom_iter *iter, size_t *lenp, uint8_t *buf) {
    ssize_t nread;
    int c, w, ww;

    if (!iter || !lenp || !buf || *lenp < 4)
        return -1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        *lenp = 0;
        return c & 0xff;
    }

    /* read first octet */
    nread = fy_atom_iter_read(iter, &buf[0], 1);
    if (nread != 1)
        return -1;

    /* get width from it (0 means illegal) - return it and mark it */
    w = fy_utf8_width_by_first_octet(buf[0]);
    if (!w) {
        *lenp = 1;
        return 0;
    }

    /* read the rest octets (if possible) */
    if (w > 1) {
        nread = fy_atom_iter_read(iter, buf + 1, w - 1);
        if (nread != (w - 1)) {
            if (nread != -1 && nread < (w - 1))
                *lenp += nread;
            return 0;
        }
    }

    /* and return the decoded utf8 character */
    c = fy_utf8_get(buf, w, &ww);
    if (c >= 0) {
        *lenp = 0;
        return c;
    }
    *lenp = w;
    return 0;
}